

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ba9::DataDump<short>::Run(DataDump<short> *this,istream *input_stream)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  long in_RDI;
  int index;
  short data;
  char buffer [128];
  undefined4 in_stack_ffffffffffffff64;
  short *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  short in_stack_ffffffffffffff84;
  
  iVar2 = *(int *)(in_RDI + 0x28);
  while( true ) {
    bVar1 = sptk::ReadStream<short>
                      (in_stack_ffffffffffffff68,
                       (istream *)CONCAT44(in_stack_ffffffffffffff64,iVar2));
    if (!bVar1) {
      return true;
    }
    bVar1 = sptk::SnPrintf<short>
                      (in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70
                       ,(char *)in_stack_ffffffffffffff68);
    if (!bVar1) break;
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,iVar2);
    poVar3 = std::operator<<(poVar3,'\t');
    poVar3 = std::operator<<(poVar3,&stack0xffffffffffffff68);
    std::operator<<(poVar3,'\n');
    if ((*(int *)(in_RDI + 0x2c) != -1) && (*(int *)(in_RDI + 0x2c) == iVar2)) {
      iVar2 = *(int *)(in_RDI + 0x28) + -1;
    }
    iVar2 = iVar2 + 1;
  }
  return false;
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    T data;
    for (int index(minimum_index_); sptk::ReadStream(&data, input_stream);
         ++index) {
      // Format data.
      if (!sptk::SnPrintf(data, print_format_, sizeof(buffer), buffer)) {
        return false;
      }

      // Dump data. Note that std::endl makes the execution speed slow.
      std::cout << index << '\t' << buffer << '\n';

      // Initialize index.
      if (maximum_index_ != kMagicNumberForEndOfFile &&
          maximum_index_ == index) {
        index = minimum_index_ - 1;
      }
    }
    return true;
  }